

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

int32_t borg_price_item(object *obj,_Bool store_buying,wchar_t qty,wchar_t this_store)

{
  owner *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t local_48;
  wchar_t local_40;
  owner *proprietor;
  int local_28;
  wchar_t price;
  wchar_t adjust;
  wchar_t this_store_local;
  wchar_t qty_local;
  _Bool store_buying_local;
  object *obj_local;
  
  local_28 = 100;
  if (this_store == (uint)f_info[0xe].shopnum + L'\xffffffff') {
    obj_local._4_4_ = L'\0';
  }
  else {
    poVar1 = stores[this_store].owner;
    _Var2 = tval_can_have_charges(obj);
    if (_Var2) {
      wVar3 = object_value_real(obj,qty);
      wVar4 = object_value(obj,qty);
      if (wVar4 < wVar3) {
        local_40 = object_value(obj,qty);
      }
      else {
        local_40 = object_value_real(obj,qty);
      }
      proprietor._4_4_ = local_40;
    }
    else {
      wVar3 = object_value_real(obj,L'\x01');
      wVar4 = object_value(obj,L'\x01');
      if (wVar4 < wVar3) {
        local_48 = object_value(obj,L'\x01');
      }
      else {
        local_48 = object_value_real(obj,L'\x01');
      }
      proprietor._4_4_ = local_48;
    }
    if (proprietor._4_4_ < L'\x01') {
      obj_local._4_4_ = L'\0';
    }
    else {
      if (this_store == (uint)f_info[0xd].shopnum + L'\xffffffff') {
        local_28 = 0x96;
      }
      if (store_buying) {
        local_28 = 200 - local_28;
        if (100 < local_28) {
          local_28 = 100;
        }
        proprietor._4_4_ = (proprietor._4_4_ << 1) / 3;
        if (this_store == (uint)f_info[0xd].shopnum + L'\xffffffff') {
          proprietor._4_4_ = proprietor._4_4_ / 2;
        }
        if (((player->opts).opt[0x26] & 1U) != 0) {
          return 0;
        }
      }
      else {
        _Var2 = tval_can_have_charges(obj);
        if (_Var2) {
          proprietor._4_4_ = object_value_real(obj,qty);
        }
        else {
          proprietor._4_4_ = object_value_real(obj,L'\x01');
        }
        if (this_store == (uint)f_info[0xd].shopnum + L'\xffffffff') {
          proprietor._4_4_ = proprietor._4_4_ << 1;
        }
      }
      proprietor._4_4_ = (wchar_t)(((long)(proprietor._4_4_ * local_28) + 0x32) / 100);
      _Var2 = tval_can_have_charges(obj);
      if (!_Var2) {
        proprietor._4_4_ = qty * proprietor._4_4_;
      }
      if ((store_buying) && (poVar1->max_cost * qty < proprietor._4_4_)) {
        proprietor._4_4_ = poVar1->max_cost * qty;
      }
      obj_local._4_4_ = qty;
      if (L'\0' < proprietor._4_4_) {
        obj_local._4_4_ = proprietor._4_4_;
      }
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int32_t borg_price_item(
    const struct object* obj, bool store_buying, int qty, int this_store)
{
    int           adjust = 100;
    int           price;
    struct owner* proprietor;

    if (this_store == f_info[FEAT_HOME].shopnum - 1) {
        return 0;
    }

    proprietor = stores[this_store].owner;

    /* Get the value of the stack of wands, or a single item */
    if (tval_can_have_charges(obj)) {
        price = MIN(object_value_real(obj, qty), object_value(obj, qty));
    } else {
        price = MIN(object_value_real(obj, 1), object_value(obj, 1));
    }

    /* Worthless items */
    if (price <= 0) {
        return 0;
    }

    /* The black market is always a worse deal */
    if (this_store == f_info[FEAT_STORE_BLACK].shopnum - 1)
        adjust = 150;

    /* Shop is buying */
    if (store_buying) {
        /* Set the factor */
        adjust = 100 + (100 - adjust);
        if (adjust > 100) {
            adjust = 100;
        }

        /* Shops now pay 2/3 of true value */
        price = price * 2 / 3;

        /* Black market sucks */
        if (this_store == f_info[FEAT_STORE_BLACK].shopnum - 1) {
            price = price / 2;
        }

        /* Check for no_selling option */
        if (OPT(player, birth_no_selling)) {
            return 0;
        }
    } else {
        /* Re-evaluate if we're selling */
        if (tval_can_have_charges(obj)) {
            price = object_value_real(obj, qty);
        } else {
            price = object_value_real(obj, 1);
        }

        /* Black market sucks */
        if (this_store == f_info[FEAT_STORE_BLACK].shopnum - 1) {
            price = price * 2;
        }
    }

    /* Compute the final price (with rounding) */
    price = (price * adjust + 50L) / 100L;

    /* Now convert price to total price for non-wands */
    if (!tval_can_have_charges(obj)) {
        price *= qty;
    }

    /* Now limit the price to the purse limit */
    if (store_buying && (price > proprietor->max_cost * qty)) {
        price = proprietor->max_cost * qty;
    }

    /* Note -- Never become "free" */
    if (price <= 0) {
        return qty;
    }

    /* Return the price */
    return price;
}